

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

void nva_rsprint(nva_regspace *regspace,nva_err err,uint64_t val)

{
  char cVar1;
  int local_24;
  char ec;
  int k;
  uint64_t val_local;
  nva_err err_local;
  nva_regspace *regspace_local;
  
  if (err == NVA_ERR_SUCCESS) {
    switch(regspace->regsz) {
    case 1:
      printf(" %02lx",val);
      break;
    case 2:
      printf(" %04lx",val);
      break;
    case 4:
      printf(" %08lx",val);
      break;
    case 8:
      printf(" %016lx",val);
    }
  }
  else {
    cVar1 = nva_rserrc(err);
    printf(" ");
    for (local_24 = 0; local_24 < regspace->regsz; local_24 = local_24 + 1) {
      printf("%c%c",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)cVar1);
    }
  }
  return;
}

Assistant:

void nva_rsprint(struct nva_regspace *regspace, enum nva_err err, uint64_t val) {
	if (err) {
		int k;
		char ec = nva_rserrc(err);
		printf(" ");
		for (k = 0; k < regspace->regsz; k++)
			printf("%c%c", ec, ec);
	} else {
		switch (regspace->regsz) {
			case 1:
				printf (" %02"PRIx64, val);
				break;
			case 2:
				printf (" %04"PRIx64, val);
				break;
			case 4:
				printf (" %08"PRIx64, val);
				break;
			case 8:
				printf (" %016"PRIx64, val);
				break;
		}
	}
}